

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
createMacro(Parser *parser,string *text,int flags,
           initializer_list<AssemblyTemplateArgument> variables)

{
  undefined4 in_register_00000014;
  initializer_list<AssemblyTemplateArgument> variables_00;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> local_60;
  size_type local_58;
  undefined1 local_40 [8];
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> content;
  int flags_local;
  string *text_local;
  Parser *parser_local;
  initializer_list<AssemblyTemplateArgument> variables_local;
  
  variables_00._M_array._4_4_ = in_register_00000014;
  variables_00._M_array._0_4_ = flags;
  local_58 = variables._M_len;
  content._M_t.super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>.
  _M_t.super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
  super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl._4_4_ = variables._M_array._0_4_;
  variables_00._M_len = local_58;
  Parser::parseTemplate((Parser *)local_40,text,variables_00);
  std::
  make_unique<MipsMacroCommand,std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,int&>
            (&local_60,(int *)local_40);
  std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
  unique_ptr<MipsMacroCommand,std::default_delete<MipsMacroCommand>,void>
            ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
             (unique_ptr<MipsMacroCommand,_std::default_delete<MipsMacroCommand>_> *)&local_60);
  std::unique_ptr<MipsMacroCommand,_std::default_delete<MipsMacroCommand>_>::~unique_ptr
            ((unique_ptr<MipsMacroCommand,_std::default_delete<MipsMacroCommand>_> *)&local_60);
  std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::~unique_ptr
            ((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)local_40);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> createMacro(Parser& parser, const std::string& text, int flags, std::initializer_list<AssemblyTemplateArgument> variables)
{
	std::unique_ptr<CAssemblerCommand> content = parser.parseTemplate(text,variables);
	return std::make_unique<MipsMacroCommand>(std::move(content),flags);
}